

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::kill_key_group(Renderer *this,int i)

{
  byte bVar1;
  WORD WVar2;
  int iVar3;
  Voice *pVVar4;
  long lVar5;
  Voice *pVVar6;
  Voice *pVVar7;
  long lVar8;
  
  pVVar4 = this->voice;
  WVar2 = (pVVar4[i].sample)->key_group;
  if (WVar2 != 0) {
    iVar3 = this->voices;
    lVar5 = (long)iVar3;
    if (lVar5 != 0) {
      lVar8 = 0;
      pVVar7 = pVVar4 + lVar5;
      do {
        pVVar6 = pVVar7 + -1;
        bVar1 = pVVar6->status;
        if (((((bVar1 & 0xd) != 1) && (~i + iVar3 != (int)lVar8)) &&
            (pVVar4[i].channel == pVVar7[-1].channel)) &&
           ((bVar1 & 1) != 0 && (pVVar7[-1].sample)->key_group == WVar2)) {
          pVVar6->status = bVar1 & 0xf1 | 0xc;
        }
        lVar8 = lVar8 + 1;
        pVVar7 = pVVar6;
      } while (lVar5 != lVar8);
    }
  }
  return;
}

Assistant:

void Renderer::kill_key_group(int i)
{
	int j = voices; 

	if (voice[i].sample->key_group == 0)
	{
		return;
	}
	while (j--)
	{
		if ((voice[j].status & VOICE_RUNNING) && !(voice[j].status & (VOICE_RELEASING | VOICE_STOPPING))) continue;
		if (i == j) continue;
		if (voice[i].channel != voice[j].channel) continue;
		if (voice[j].sample->key_group != voice[i].sample->key_group) continue;
		kill_note(j);
	}
}